

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O3

char * deqp::gls::MemObjectAllocator::resultToString(Result result)

{
  if (result < RESULT_LAST) {
    return &DAT_00b590a4 + *(int *)(&DAT_00b590a4 + (ulong)result * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* MemObjectAllocator::resultToString (Result result)
{
	switch (result)
	{
		case RESULT_GOT_BAD_ALLOC:
			return "Caught std::bad_alloc";
			break;

		case RESULT_GEN_TEXTURES_FAILED:
			return "glGenTextures failed";
			break;

		case RESULT_GEN_BUFFERS_FAILED:
			return "glGenBuffers failed";
			break;

		case RESULT_BUFFER_DATA_FAILED:
			return "glBufferData failed";
			break;

		case RESULT_BUFFER_SUB_DATA_FAILED:
			return "glBufferSubData failed";
			break;

		case RESULT_TEXTURE_IMAGE_FAILED:
			return "glTexImage2D failed";
			break;

		case RESULT_TEXTURE_SUB_IMAGE_FAILED:
			return "glTexSubImage2D failed";
			break;

		case RESULT_BIND_TEXTURE_FAILED:
			return "glBindTexture failed";
			break;

		case RESULT_BIND_BUFFER_FAILED:
			return "glBindBuffer failed";
			break;

		case RESULT_DELETE_TEXTURES_FAILED:
			return "glDeleteTextures failed";
			break;

		case RESULT_DELETE_BUFFERS_FAILED:
			return "glDeleteBuffers failed";
			break;

		case RESULT_RENDER_FAILED:
			return "Rendering result failed";
			break;

		default:
			DE_ASSERT(false);
			return NULL;
	}
}